

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

void init_tokenizer(void)

{
  uchar uVar1;
  SymbolInfo val;
  uint local_1c;
  int i;
  SymbolInfo sym;
  uchar *p;
  
  file_stack_ptr = 0;
  if (tok_sym_table != (SymbolTable *)0x0) {
    free_symbol_table(tok_sym_table);
  }
  tok_sym_table = make_symbol_table();
  for (local_1c = 0; local_1c < 0x20a; local_1c = local_1c + 1) {
    val.n._4_4_ = 0;
    val.n._0_4_ = token_list[(int)local_1c].value;
    insert_symbol(tok_sym_table,token_list[(int)local_1c].name,val);
  }
  for (sym.p = init_tokenizer::break_chars; *sym.p != '\0'; sym.p = (void *)(sym.n + 1)) {
    break_char_table[(int)(*sym.p + 1)] = '\x01';
  }
  break_char_table[0] = '\x01';
  num_conv_table[0x30] = 0xf0;
  num_conv_table[0x31] = 0xf1;
  for (local_1c = 0x32; (int)local_1c < 0x38; local_1c = local_1c + 1) {
    num_conv_table[(int)local_1c] = (char)local_1c + 0xb0;
  }
  num_conv_table[0x38] = 200;
  num_conv_table[0x39] = 0xc9;
  for (local_1c = 0; (int)local_1c < 7; local_1c = local_1c + 1) {
    uVar1 = (char)local_1c + 0x8a;
    num_conv_table[(int)(local_1c + 0x61)] = uVar1;
    num_conv_table[(int)(local_1c + 0x41)] = uVar1;
  }
  return;
}

Assistant:

void
init_tokenizer ()
{
  static const unsigned char break_chars[] = " \t\n\r();";
  const unsigned char *p;
  SymbolInfo sym;
  int i;

  /* Start out with 0 open streams. */
  file_stack_ptr = 0;

  /* Initialize the symbol table. */
  if (tok_sym_table != NULL)
    free_symbol_table (tok_sym_table);

  tok_sym_table = make_symbol_table ();
  for (i = 0; i < (sizeof token_list / sizeof token_list[0]); i++)
    {
      sym.n = token_list[i].value;
      insert_symbol (tok_sym_table, token_list[i].name, sym);
    }

  /* Initialize break character table. */
  for (p = &break_chars[0]; *p; p++)
    break_char_table[*p + 1] = TRUE;
  break_char_table[EOF + 1] = TRUE;

  /* Initialize ascii -> number conversion table. */
  num_conv_table['0'] = (ALL_MASKS + 0);
  num_conv_table['1'] = (ALL_MASKS + 1);
  for (i = '2'; i < '8'; i++)
    num_conv_table[i] = (ALL_MASKS - BINARY_MASK) + i - '0';
  num_conv_table['8'] = (DECIMAL_MASK + HEX_MASK + 8);
  num_conv_table['9'] = (DECIMAL_MASK + HEX_MASK + 9);
  for (i = 0; i < 7; i++)
    num_conv_table[i + 'A'] = num_conv_table[i + 'a'] = (HEX_MASK + i + 10);
}